

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconnect.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  allocator<char> local_d1;
  string local_d0;
  ReconnectingHub reconnectingHub;
  
  if (argc < 2) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Usage ");
    poVar1 = std::operator<<(poVar1,*argv);
    poVar1 = std::operator<<(poVar1," target");
    std::endl<char,std::char_traits<char>>(poVar1);
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,argv[1],&local_d1);
  ReconnectingHub::ReconnectingHub(&reconnectingHub,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  do {
    ReconnectingHub::stepAndReconnect(&reconnectingHub);
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
	try
	{
		if (argc > 1)
		{
			ReconnectingHub reconnectingHub(argv[1]);
			while (true)
			{
				reconnectingHub.stepAndReconnect();
			}
		}
		else
		{
			cerr << "Usage " << argv[0] << " target" << endl;
			return 1;
		}
	}
	catch (const DashelException& e)
	{
		cerr << e.what() << endl;
	}

	return 0;
}